

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O3

void density_tests::
     LfFunctionQueueSamples<(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
     ::func_queue_try_reentrant_put_samples(ostream *i_ostream)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  undefined8 *puVar4;
  void *pvVar5;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  queue;
  PrintScopeDuration dur;
  reentrant_put_transaction<Func> local_160;
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  local_140;
  reentrant_put_transaction<Func> local_c0;
  Func_conflict local_a0;
  PrintScopeDuration local_90 [2];
  
  PrintScopeDuration::PrintScopeDuration
            (local_90,i_ostream,"lock-free function queue reentrant put samples");
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .m_head = (ControlBlock *)0x0;
  bVar1 = density::
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
          ::
          try_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::_lambda()_1_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::_lambda()_1_>
                    ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
                      *)&local_140,progress_lock_free,(anon_class_1_0_00000001 *)&local_c0);
  if (bVar1) {
    do {
      bVar1 = density::
              lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              ::try_reentrant_consume_impl(&local_140);
    } while (bVar1);
  }
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::~lf_function_queue(&local_140);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .m_head = (ControlBlock *)0x0;
  local_c0.m_put.m_control_block._0_4_ = 7;
  bVar1 = density::
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
          ::
          try_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
                    ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
                      *)&local_140,progress_lock_free,(int *)&local_c0);
  if (bVar1) {
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
            ::try_reentrant_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x250,
                    "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_relaxed>::func_queue_try_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_relaxed]"
                   );
    }
  }
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::~lf_function_queue(&local_140);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .m_head = (ControlBlock *)0x0;
  local_a0.m_string_1 = (char *)0x0;
  local_a0.m_string_2 = (char *)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::
  try_start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
            (&local_c0,
             (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
              *)&local_140,progress_lock_free,&local_a0);
  local_160.m_put.m_control_block =
       (LfQueueControl *)
       CONCAT44(local_c0.m_put.m_control_block._4_4_,local_c0.m_put.m_control_block._0_4_);
  local_160.m_put.m_next_ptr = local_c0.m_put.m_next_ptr;
  local_160.m_put.m_user_storage = local_c0.m_put.m_user_storage;
  local_160.m_queue = local_c0.m_queue;
  if (local_c0.m_put.m_user_storage != (void *)0x0) {
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_160,0xc,1);
    lVar3 = 0;
    do {
      *(char *)((long)pvVar2 + lVar3) = "Hello world"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xc);
    puVar4 = (undefined8 *)
             density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::element_ptr(&local_160);
    *puVar4 = pvVar2;
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_160,0x12,1);
    lVar3 = 0;
    do {
      *(char *)((long)pvVar2 + lVar3) = "\t(I\'m so happy)!!"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x12);
    pvVar5 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::element_ptr(&local_160);
    *(void **)((long)pvVar5 + 8) = pvVar2;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::commit(&local_160);
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
            ::try_reentrant_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x279,
                    "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_relaxed>::func_queue_try_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_relaxed]"
                   );
    }
  }
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::~lf_function_queue(&local_140);
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_140.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .m_head = (ControlBlock *)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
  ::
  try_start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
            (&local_c0,
             (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
              *)&local_140,progress_lock_free);
  local_160.m_put.m_control_block =
       (LfQueueControl *)
       CONCAT44(local_c0.m_put.m_control_block._4_4_,local_c0.m_put.m_control_block._0_4_);
  local_160.m_put.m_next_ptr = local_c0.m_put.m_next_ptr;
  local_160.m_put.m_user_storage = local_c0.m_put.m_user_storage;
  local_160.m_queue = local_c0.m_queue;
  if (local_c0.m_put.m_user_storage != (void *)0x0) {
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_160,0xc,1);
    lVar3 = 0;
    do {
      *(char *)((long)pvVar2 + lVar3) = "Hello world"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xc);
    puVar4 = (undefined8 *)
             density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::element_ptr(&local_160);
    *puVar4 = pvVar2;
    pvVar2 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_160,0x12,1);
    lVar3 = 0;
    do {
      *(char *)((long)pvVar2 + lVar3) = "\t(I\'m so happy)!!"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x12);
    pvVar5 = density::
             lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
             ::reentrant_put_transaction<Func>::element_ptr(&local_160);
    *(void **)((long)pvVar5 + 8) = pvVar2;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::commit(&local_160);
    bVar1 = density::
            lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
            ::try_reentrant_consume_impl(&local_140);
    if (!bVar1) {
      __assert_fail("invoked",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x2a2,
                    "static void density_tests::LfFunctionQueueSamples<density::function_manual_clear, density::concurrency_multiple, density::concurrency_single, density::consistency_relaxed>::func_queue_try_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_single, CONSISTENCY_MODEL = density::consistency_relaxed]"
                   );
    }
  }
  density::
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::~lf_function_queue(&local_140);
  PrintScopeDuration::~PrintScopeDuration(local_90);
  return;
}

Assistant:

static void func_queue_try_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "lock-free function queue reentrant put samples");

            using namespace density;

            {
                //! [lf_function_queue try_reentrant_push example 1]
                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;
                if (queue.try_reentrant_push(
                      progress_lock_free, [] { std::cout << "Hello world"; }))
                {
                    while (queue.try_reentrant_consume())
                        ;
                }
                //! [lf_function_queue try_reentrant_push example 1]
            }
            {
                //! [lf_function_queue try_reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool invoked = false;
                if (queue.template try_reentrant_emplace<Func>(progress_lock_free, 7))
                {
                    invoked = queue.try_reentrant_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool invoked = false;
                if (auto transaction = queue.try_start_reentrant_push(progress_lock_free, Func{}))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    // now transaction is empty

                    invoked = queue.try_reentrant_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [lf_function_queue try_start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                bool invoked = false;
                if (
                  auto transaction =
                    queue.template try_start_reentrant_emplace<Func>(progress_lock_free))
                {
                    // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                    transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                    transaction.element().m_string_2 =
                      transaction.raw_allocate_copy("\t(I'm so happy)!!");

                    transaction.commit();

                    invoked = queue.try_reentrant_consume();
                    assert(invoked);
                }
                //! [lf_function_queue try_start_reentrant_emplace example 1]
                (void)invoked;
            }
        }